

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<double>::InternalDeallocate<true>(RepeatedField<double> *this)

{
  int iVar1;
  anon_union_8_2_a06a818b_for_HeapRep<8UL>_1 *paVar2;
  HeapRep *pHVar3;
  LongSooRep *pLVar4;
  undefined1 auStack_38 [8];
  undefined8 uStack_30;
  LongSooRep local_20;
  
  if ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0) {
    iVar1 = (this->soo_rep_).field_0.long_rep.capacity;
    uStack_30._0_4_ = 0x255b52;
    uStack_30._4_4_ = 0;
    paVar2 = &heap_rep(this)->field_0;
    if (paVar2->arena == (Arena *)0x0) {
      uStack_30._0_4_ = 0x255b70;
      uStack_30._4_4_ = 0;
      pHVar3 = heap_rep(this);
      operator_delete(pHVar3,(long)iVar1 * 8 + 8);
      return;
    }
    return;
  }
  pLVar4 = &local_20;
  uStack_30 = heap_rep;
  InternalDeallocate<true>((RepeatedField<double> *)pLVar4);
  if ((pLVar4->elements_int & 4) == 0) {
    pLVar4 = (LongSooRep *)auStack_38;
    heap_rep();
    iVar1 = internal::SooRep::size((SooRep *)pLVar4,(pLVar4->elements_int & 4) == 0);
    if (((pLVar4->elements_int & 4) != 0) && (iVar1 != pLVar4->capacity)) {
      internal::LongSooRep::elements(pLVar4);
      return;
    }
    return;
  }
  internal::LongSooRep::elements(pLVar4);
  return;
}

Assistant:

bool is_soo() const { return (arena_and_size & kNotSooBit) == 0; }